

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resample_filters.cpp
# Opt level: O0

float crnlib::quadratic(float t,float R)

{
  float tt;
  float R_local;
  float t_local;
  undefined4 local_4;
  
  t_local = t;
  if (t < 0.0) {
    t_local = -t;
  }
  if (1.5 <= t_local) {
    local_4 = 0.0;
  }
  else if (0.5 < t_local) {
    local_4 = R * t_local * t_local + (R * -2.0 - 0.5) * t_local + (R + 1.0) * 0.75;
  }
  else {
    local_4 = R * -2.0 * t_local * t_local + (R + 1.0) * 0.5;
  }
  return local_4;
}

Assistant:

static float quadratic(float t, const float R) {
  if (t < 0.0f)
    t = -t;
  if (t < QUADRATIC_SUPPORT) {
    float tt = t * t;
    if (t <= .5f)
      return (-2.0f * R) * tt + .5f * (R + 1.0f);
    else
      return (R * tt) + (-2.0f * R - .5f) * t + (3.0f / 4.0f) * (R + 1.0f);
  } else
    return 0.0f;
}